

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O3

void __thiscall pbrt::SubSurfaceMaterial::readFrom(SubSurfaceMaterial *this,BinaryReader *binary)

{
  size_t sVar1;
  pointer puVar2;
  size_t sVar3;
  runtime_error *this_00;
  pointer __buf;
  
  Material::readFrom(&this->super_Material,binary);
  puVar2 = (binary->currentEntityData).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((ulong)((long)(binary->currentEntityData).
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)puVar2) <
      binary->currentEntityOffset + 4) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_00,"invalid read attempt by entity - not enough data in data block!");
  }
  else {
    this->uRoughness = *(float *)(puVar2 + binary->currentEntityOffset);
    sVar3 = binary->currentEntityOffset;
    sVar1 = sVar3 + 4;
    binary->currentEntityOffset = sVar1;
    puVar2 = (binary->currentEntityData).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)((long)(binary->currentEntityData).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)puVar2) < sVar3 + 8) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (this_00,"invalid read attempt by entity - not enough data in data block!");
    }
    else {
      this->vRoughness = *(float *)(puVar2 + sVar1);
      sVar3 = binary->currentEntityOffset;
      sVar1 = sVar3 + 4;
      binary->currentEntityOffset = sVar1;
      __buf = (pointer)(sVar3 + 5);
      puVar2 = (binary->currentEntityData).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (__buf <= (binary->currentEntityData).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish + -(long)puVar2) {
        this->remapRoughness = (bool)puVar2[sVar1];
        binary->currentEntityOffset = binary->currentEntityOffset + 1;
        BinaryReader::read(binary,(int)this + 0x48,__buf,(size_t)puVar2);
        return;
      }
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (this_00,"invalid read attempt by entity - not enough data in data block!");
    }
  }
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void SubSurfaceMaterial::readFrom(BinaryReader &binary) 
  {
    Material::readFrom(binary);
    binary.read(uRoughness);
    binary.read(vRoughness);
    binary.read(remapRoughness);
    binary.read(name);
  }